

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O0

int mbedtls_x509write_crt_set_key_usage(mbedtls_x509write_cert *ctx,uint key_usage)

{
  uchar *puStack_30;
  int ret;
  uchar *c;
  uchar local_20 [4];
  uint uStack_1c;
  uchar ku;
  uchar buf [4];
  uint key_usage_local;
  mbedtls_x509write_cert *ctx_local;
  
  if ((key_usage & 0xffffff01) == 0) {
    puStack_30 = (uchar *)&stack0xffffffffffffffe4;
    c._7_1_ = (undefined1)key_usage;
    uStack_1c = key_usage;
    _buf = ctx;
    ctx_local._4_4_ =
         mbedtls_asn1_write_bitstring(&stack0xffffffffffffffd0,local_20,(uchar *)((long)&c + 7),7);
    if ((ctx_local._4_4_ == 4) &&
       (ctx_local._4_4_ = mbedtls_x509write_crt_set_extension(_buf,"U\x1d\x0f",3,1,local_20,4),
       ctx_local._4_4_ == 0)) {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = -0x2080;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_x509write_crt_set_key_usage( mbedtls_x509write_cert *ctx,
                                         unsigned int key_usage )
{
    unsigned char buf[4], ku;
    unsigned char *c;
    int ret;

    /* We currently only support 7 bits, from 0x80 to 0x02 */
    if( ( key_usage & ~0xfe ) != 0 )
        return( MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE );

    c = buf + 4;
    ku = (unsigned char) key_usage;

    if( ( ret = mbedtls_asn1_write_bitstring( &c, buf, &ku, 7 ) ) != 4 )
        return( ret );

    ret = mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_KEY_USAGE,
                                       MBEDTLS_OID_SIZE( MBEDTLS_OID_KEY_USAGE ),
                                       1, buf, 4 );
    if( ret != 0 )
        return( ret );

    return( 0 );
}